

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O2

void __thiscall xLearn::MODEL_TEST_Init_ffm_Test::TestBody(MODEL_TEST_Init_ffm_Test *this)

{
  real_t *prVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  index_t j;
  ulong uVar7;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_318;
  AssertHelper local_310;
  AssertionResult gtest_ar;
  index_t param_num_v;
  real_t *local_2f0;
  int local_2e4;
  uint local_2e0;
  index_t param_num_w;
  real_t *local_2d8;
  Model model_ffm;
  HyperParam hyper_param;
  
  Init();
  model_ffm.score_func_._M_dataplus._M_p = (pointer)&model_ffm.score_func_.field_2;
  model_ffm.score_func_._M_string_length = 0;
  model_ffm.score_func_.field_2._M_local_buf[0] = '\0';
  model_ffm.loss_func_._M_dataplus._M_p = (pointer)&model_ffm.loss_func_.field_2;
  model_ffm.loss_func_._M_string_length = 0;
  model_ffm.loss_func_.field_2._M_local_buf[0] = '\0';
  model_ffm.param_w_ = (real_t *)0x0;
  model_ffm.param_v_ = (real_t *)0x0;
  model_ffm.param_b_ = (real_t *)0x0;
  model_ffm.param_best_w_ = (real_t *)0x0;
  model_ffm.param_best_v_ = (real_t *)0x0;
  model_ffm.param_best_b_ = (real_t *)0x0;
  Model::Initialize(&model_ffm,&hyper_param.score_func,&hyper_param.loss_func,
                    hyper_param.num_feature,hyper_param.num_field,hyper_param.num_K,
                    hyper_param.auxiliary_size,1.0);
  prVar1 = model_ffm.param_b_;
  param_num_w = hyper_param.num_feature * 2;
  local_2f0 = model_ffm.param_w_;
  local_2d8 = model_ffm.param_v_;
  param_num_v = param_num_w * hyper_param.num_field * hyper_param.num_K;
  local_318.ptr_._0_4_ = model_ffm.param_num_w_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"param_num_w","model_ffm.GetNumParameter_w()",&param_num_w,
             (uint *)&local_318);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_318);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters_test.cc"
               ,0x3c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_318);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_318.ptr_._0_4_ = model_ffm.param_num_v_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"param_num_v","model_ffm.GetNumParameter_v()",&param_num_v,
             (uint *)&local_318);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_318);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters_test.cc"
               ,0x3d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_318);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_318.ptr_._0_4_ = param_num_v + 2 + param_num_w;
  local_310.data_._0_4_ = model_ffm.param_num_w_ + 2 + model_ffm.param_num_v_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"param_num_v+param_num_w+2","model_ffm.GetNumParameter()",
             (uint *)&local_318,(uint *)&local_310);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_318);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters_test.cc"
               ,0x3e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_318);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<float>((internal *)&gtest_ar,"b[0]","0",*prVar1,0.0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_318);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters_test.cc"
               ,0x3f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_318);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)&gtest_ar,"b[1]","1.0",prVar1[1],1.0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_318);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters_test.cc"
               ,0x40,pcVar5);
    testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_318);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  uVar6 = (ulong)hyper_param.auxiliary_size;
  for (uVar4 = 0; (uint)uVar4 < model_ffm.param_num_w_; uVar4 = uVar4 + uVar6) {
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)&gtest_ar,"w[i]","0.0",local_2f0[uVar4 & 0xffffffff],0.0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_318);
      pcVar5 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_310,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters_test.cc"
                 ,0x44,pcVar5);
      testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_318);
      testing::internal::AssertHelper::~AssertHelper(&local_310);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_318);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    for (uVar7 = 1; uVar7 < uVar6; uVar7 = uVar7 + 1) {
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)&gtest_ar,"w[i+j]","1.0",local_2f0[(uint)uVar4 + (int)uVar7],1.0);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_318);
        pcVar5 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_310,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters_test.cc"
                   ,0x46,pcVar5);
        testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_318);
        testing::internal::AssertHelper::~AssertHelper(&local_310);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_318);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
  }
  local_2e4 = hyper_param.auxiliary_size * 4;
  local_2e0 = model_ffm.param_num_v_;
  uVar3 = 4;
  uVar2 = 0;
  while (uVar2 < local_2e0) {
    local_2f0 = (real_t *)CONCAT44(local_2f0._4_4_,uVar2);
    uVar2 = uVar3;
    for (uVar4 = 1; uVar4 < uVar6; uVar4 = uVar4 + 1) {
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)&gtest_ar,"v[i+kAlign*j]","1.0",local_2d8[uVar2],1.0);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_318);
        pcVar5 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_310,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters_test.cc"
                   ,0x4d,pcVar5);
        testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_318);
        testing::internal::AssertHelper::~AssertHelper(&local_310);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_318);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      uVar2 = uVar2 + 4;
    }
    uVar3 = uVar3 + local_2e4;
    uVar2 = (int)local_2f0 + local_2e4;
  }
  Model::~Model(&model_ffm);
  HyperParam::~HyperParam(&hyper_param);
  return;
}

Assistant:

TEST(MODEL_TEST, Init_ffm) {
  HyperParam hyper_param = Init();
  Model model_ffm;
  model_ffm.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K,
                    hyper_param.auxiliary_size);
  real_t* b = model_ffm.GetParameter_b();
  real_t* w = model_ffm.GetParameter_w();
  index_t param_num_w = hyper_param.num_feature * 2;
  real_t* v = model_ffm.GetParameter_v();
  index_t param_num_v = hyper_param.num_feature *
                      hyper_param.num_field *
                      hyper_param.num_K * 2;
  EXPECT_EQ(param_num_w, model_ffm.GetNumParameter_w());
  EXPECT_EQ(param_num_v, model_ffm.GetNumParameter_v());
  EXPECT_EQ(param_num_v+param_num_w+2, model_ffm.GetNumParameter());
  EXPECT_FLOAT_EQ(b[0], 0);
  EXPECT_FLOAT_EQ(b[1], 1.0);
  index_t len = model_ffm.GetNumParameter_w();
  index_t aux_size = hyper_param.auxiliary_size;
  for (index_t i = 0; i < len; i += aux_size) {
    EXPECT_FLOAT_EQ(w[i], 0.0);
    for (index_t j = 1; j < aux_size; ++j) {
      EXPECT_FLOAT_EQ(w[i+j], 1.0);
    }

  }
  len = model_ffm.GetNumParameter_v();
  for (index_t i = 0; i < len; i+=(kAlign*aux_size)) {
    for (index_t j = 1; j < aux_size; ++j) {
      EXPECT_FLOAT_EQ(v[i+kAlign*j], 1.0);
    }
  }
}